

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day.h
# Opt level: O1

void __thiscall Day::print(Day *this)

{
  ostream *poVar1;
  pointer pLVar2;
  ulong uVar3;
  long lVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"day: ",5);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->name)._M_dataplus._M_p,
                      (this->name)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  pLVar2 = (this->lessons).super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->lessons).super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
      super__Vector_impl_data._M_finish != pLVar2) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      Lesson::print((Lesson *)((long)&pLVar2->lesson_id + lVar4));
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
      std::ostream::put(-0x70);
      std::ostream::flush();
      uVar3 = uVar3 + 1;
      pLVar2 = (this->lessons).super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0xa8;
    } while (uVar3 < (ulong)(((long)(this->lessons).
                                    super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pLVar2 >> 3) *
                            -0x30c30c30c30c30c3));
  }
  return;
}

Assistant:

void Day::print() {
    std::cout << "day: " << name << std::endl;
    for (size_t i = 0; i < lessons.size(); i++) {
        lessons[i].print();
        std::cout << std::endl;
    }
}